

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int vorbis_decode_initial
              (vorb *f,int *p_left_start,int *p_left_end,int *p_right_start,int *p_right_end,
              int *mode)

{
  uint8 uVar1;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  
  f->channel_buffer_start = 0;
  f->channel_buffer_end = 0;
  if (f->eof == 0) {
    while (iVar2 = maybe_start_packet(f), iVar2 != 0) {
      uVar3 = get_bits(f,1);
      if (uVar3 == 0) {
        iVar2 = ilog(f->mode_count + -1);
        uVar3 = get_bits(f,iVar2);
        if (uVar3 == 0xffffffff) {
          return 0;
        }
        if (f->mode_count <= (int)uVar3) {
          return 0;
        }
        *mode = uVar3;
        if (f->mode_config[(int)uVar3].blockflag == '\0') {
          iVar2 = f->blocksize_0;
          iVar6 = iVar2 >> 1;
          bVar9 = true;
          bVar8 = false;
        }
        else {
          iVar2 = f->blocksize_1;
          uVar4 = get_bits(f,1);
          uVar5 = get_bits(f,1);
          bVar8 = uVar5 != 0;
          uVar1 = f->mode_config[(int)uVar3].blockflag;
          bVar9 = uVar1 == '\0';
          iVar6 = iVar2 >> 1;
          if ((uVar4 == 0) && (uVar1 != '\0')) {
            *p_left_start = iVar2 - f->blocksize_0 >> 2;
            iVar7 = f->blocksize_0 + iVar2 >> 2;
            goto LAB_0016fb77;
          }
        }
        *p_left_start = 0;
        iVar7 = iVar6;
LAB_0016fb77:
        *p_left_end = iVar7;
        if ((bVar8) || (bVar9)) {
          *p_right_start = iVar6;
        }
        else {
          *p_right_start = iVar2 * 3 - f->blocksize_0 >> 2;
          iVar2 = iVar2 * 3 + f->blocksize_0 >> 2;
        }
        *p_right_end = iVar2;
        return 1;
      }
      if (f->push_mode != '\0') {
        f->error = VORBIS_bad_packet_type;
        return 0;
      }
      do {
        iVar2 = get8_packet_raw(f);
        f->valid_bits = 0;
      } while (iVar2 != -1);
      if (f->eof != 0) {
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int vorbis_decode_initial(vorb *f, int *p_left_start, int *p_left_end, int *p_right_start, int *p_right_end, int *mode)
{
   Mode *m;
   int i, n, prev, next, window_center;
   f->channel_buffer_start = f->channel_buffer_end = 0;

  retry:
   if (f->eof) return FALSE;
   if (!maybe_start_packet(f))
      return FALSE;
   // check packet type
   if (get_bits(f,1) != 0) {
      if (IS_PUSH_MODE(f))
         return error(f,VORBIS_bad_packet_type);
      while (EOP != get8_packet(f));
      goto retry;
   }

   if (f->alloc.alloc_buffer)
      assert(f->alloc.alloc_buffer_length_in_bytes == f->temp_offset);

   i = get_bits(f, ilog(f->mode_count-1));
   if (i == EOP) return FALSE;
   if (i >= f->mode_count) return FALSE;
   *mode = i;
   m = f->mode_config + i;
   if (m->blockflag) {
      n = f->blocksize_1;
      prev = get_bits(f,1);
      next = get_bits(f,1);
   } else {
      prev = next = 0;
      n = f->blocksize_0;
   }

// WINDOWING

   window_center = n >> 1;
   if (m->blockflag && !prev) {
      *p_left_start = (n - f->blocksize_0) >> 2;
      *p_left_end   = (n + f->blocksize_0) >> 2;
   } else {
      *p_left_start = 0;
      *p_left_end   = window_center;
   }
   if (m->blockflag && !next) {
      *p_right_start = (n*3 - f->blocksize_0) >> 2;
      *p_right_end   = (n*3 + f->blocksize_0) >> 2;
   } else {
      *p_right_start = window_center;
      *p_right_end   = n;
   }

   return TRUE;
}